

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O2

void mh_assoc_clear(mh_assoc_t *h)

{
  assoc_val **ppaVar1;
  
  tnt_mem_free(h->p);
  h->prime = 0;
  h->n_buckets = 3;
  ppaVar1 = (assoc_val **)tnt_mem_calloc(3,8);
  h->p = ppaVar1;
  h->upper_bound = (mh_int_t)(long)((double)h->n_buckets * 0.7);
  return;
}

Assistant:

void
_mh(clear)(struct _mh(t) *h)
{
	MH_FREE(h->p);
	h->prime = 0;
	h->n_buckets = __ac_prime_list[h->prime];
	h->p = (mh_node_t *) MH_CALLOC(h->n_buckets, sizeof(mh_node_t));
	h->upper_bound = h->n_buckets * MH_DENSITY;
}